

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O2

void __thiscall ManchesterAnalyzer::SynchronizeManchester(ManchesterAnalyzer *this)

{
  bool bVar1;
  U32 UVar2;
  pointer puVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  pointer puVar7;
  U32 UVar8;
  pointer puVar9;
  ulong uVar10;
  U64 edge_location;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> locations_to_save;
  
  while( true ) {
    while( true ) {
      if (this->mSynchronized != false) {
        return;
      }
      Analyzer::CheckIfThreadShouldExit();
      edge_location = AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToNextEdge();
      lVar5 = AnalyzerChannelData::GetSampleNumber();
      uVar6 = lVar5 - edge_location;
      UVar8 = this->mT;
      UVar2 = this->mTError;
      if (UVar2 + UVar8 <= uVar6 || uVar6 <= UVar8 - UVar2) break;
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (&this->mUnsyncedLocations,&edge_location);
    }
    if (uVar6 < UVar2 + UVar8 * 2 && UVar8 * 2 - UVar2 < uVar6) break;
    Invalidate(this);
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
            (&this->mUnsyncedLocations,&edge_location);
  this->mSynchronized = true;
  iVar4 = AnalyzerChannelData::GetBitState();
  bVar1 = ((this->mSettings)._M_ptr)->mInverted;
  if ((iVar4 == 0 & bVar1) == 0) {
    UVar8 = 0;
    if ((iVar4 == 1 & bVar1) == 0) {
      UVar8 = (U32)(bVar1 == false && iVar4 == 1);
    }
  }
  else {
    UVar8 = 1;
  }
  locations_to_save.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  locations_to_save.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  locations_to_save.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar7 = (this->mUnsyncedLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar9 = (this->mUnsyncedLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while (puVar9 != puVar7) {
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
              (&locations_to_save,puVar9 + -1);
    puVar7 = (this->mUnsyncedLocations).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->mUnsyncedLocations).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar9 = puVar3 + -1;
    (this->mUnsyncedLocations).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar9;
    if (puVar9 != puVar7) {
      puVar9 = puVar3 + -2;
      (this->mUnsyncedLocations).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar9;
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long_long*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (locations_to_save.
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             locations_to_save.
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  uVar6 = (long)locations_to_save.
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)locations_to_save.
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  for (uVar10 = 0; (uVar6 >> 3 & 0xffffffff) != uVar10; uVar10 = uVar10 + 1) {
    SaveBit(this,locations_to_save.
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar10],UVar8);
  }
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&locations_to_save.
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
  return;
}

Assistant:

void ManchesterAnalyzer::SynchronizeManchester()
{
    // we should already be on an edge, the first one out of idle.
    while( mSynchronized == false )
    {
        CheckIfThreadShouldExit();
        U64 edge_location = mManchester->GetSampleNumber();
        mManchester->AdvanceToNextEdge();
        U64 next_edge_location = mManchester->GetSampleNumber();
        U64 edge_distance = next_edge_location - edge_location;
        if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short
        {
            mUnsyncedLocations.push_back( edge_location );
        }
        else if( ( edge_distance > ( ( 2 * mT ) - mTError ) ) && ( edge_distance < ( ( 2 * mT ) + mTError ) ) ) // long
        {
            mUnsyncedLocations.push_back( edge_location );
            mSynchronized = true;
            BitState current_bit_state = mManchester->GetBitState();
            bool inverted = mSettings->mInverted;
            U32 bit_value = 0;
            if( ( inverted == true ) && ( current_bit_state == BIT_LOW ) ) // we are on a neg edge with inverted true
                bit_value = 1;                                             // the old marker will be the opposite of the current value.
            else if( ( inverted == true ) && ( current_bit_state == BIT_HIGH ) )
                bit_value = 0;
            else if( ( inverted == false ) && ( current_bit_state == BIT_LOW ) ) // we are on a neg edge with inverted false
                bit_value = 0;
            else if( ( inverted == false ) && ( current_bit_state == BIT_HIGH ) )
                bit_value = 1;
            std::vector<U64> locations_to_save;
            while( mUnsyncedLocations.size() > 0 )
            {
                locations_to_save.push_back( mUnsyncedLocations.back() );
                mUnsyncedLocations.pop_back();
                if( mUnsyncedLocations.size() > 0 )
                    mUnsyncedLocations.pop_back();
            }
            std::sort( locations_to_save.begin(), locations_to_save.end() );
            U32 count = locations_to_save.size();
            for( U32 i = 0; i < count; ++i )
                SaveBit( locations_to_save[ i ], bit_value );
            break;
        }
        else
        {
            // back to idle.
            Invalidate();
        }
    }
}